

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O3

int __thiscall
CVmObjVector::getp_append_all(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  ushort uVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  vm_val_t *this_00;
  vm_val_t ele;
  vm_val_t local_50;
  vm_val_t local_40;
  
  if (getp_append_all(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_append_all();
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,argc,&getp_append_all::desc);
  if (iVar5 == 0) {
    this_00 = sp_ + -1;
    retval->typ = VM_OBJ;
    (retval->val).obj = self;
    pvVar4 = sp_;
    uVar3 = *(undefined4 *)&retval->field_0x4;
    aVar2 = retval->val;
    sp_ = sp_ + 1;
    pvVar4->typ = retval->typ;
    *(undefined4 *)&pvVar4->field_0x4 = uVar3;
    pvVar4->val = aVar2;
    uVar1 = *(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
    iVar5 = vm_val_t::ll_length(this_00);
    set_element_count_undo
              (this,self,
               (ulong)*(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2) +
               (long)iVar5);
    if (0 < iVar5) {
      lVar6 = (ulong)uVar1 << 0x20;
      uVar7 = 1;
      do {
        local_50.typ = VM_INT;
        local_50.val.obj = (vm_obj_id_t)uVar7;
        vm_val_t::ll_index(this_00,&local_40,&local_50);
        vmb_put_dh((this->super_CVmObjCollection).super_CVmObject.ext_ + (lVar6 >> 0x20) * 5 + 4,
                   &local_40);
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0x100000000;
      } while (iVar5 + 1 != uVar7);
    }
    sp_ = sp_ + -2;
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_append_all(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                  uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the value to append, but leave it on the stack */
    vm_val_t *valp = G_stk->get(0);

    /* the result object is 'self' */
    retval->set_obj(self);

    /* push a self-reference for gc protection */
    G_stk->push(retval);

    /* get the old size */
    int cnt = get_element_count();

    /* get the number of items to add */
    int add_cnt = valp->ll_length(vmg0_);

    /* expand myself to make room for the new elements */
    expand_by(vmg_ self, add_cnt);

    /* add the new elements */
    for (int i = 1 ; i <= add_cnt ; ++i)
    {
        /* get the next new element */
        vm_val_t ele;
        valp->ll_index(vmg_ &ele, i);
        
        /* 
         *   add the new element - note that we don't need to keep undo
         *   because we created this new element in this same operation, and
         *   hence undoing the operation will truncate the vector to exclude
         *   the element, and hence we don't need an old value for the
         *   element 
         */
        set_element(cnt + i - 1, &ele);
    }

    /* discard the argument and gc protection */
    G_stk->discard(2);

    /* handled */
    return TRUE;
}